

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  uint64_t *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  char *pcVar6;
  VarData *pVVar7;
  bool bVar8;
  int j;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  lbool local_5d;
  uint32_t local_5c;
  Lit p_1;
  Lit p_local;
  
  if ((this->analyze_stack).data != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  local_5c = abstract_levels;
  p_local = p;
  vec<Minisat::Lit>::push(&this->analyze_stack,&p_local);
  iVar2 = (this->analyze_toclear).sz;
  lVar9 = (long)iVar2;
  while( true ) {
    iVar3 = (this->analyze_stack).sz;
    if ((long)iVar3 < 1) break;
    puVar5 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    uVar11 = (ulong)(this->vardata).data[(this->analyze_stack).data[(long)iVar3 + -1].x >> 1].reason
    ;
    (this->analyze_stack).sz = iVar3 + -1;
    if ((uint)((ulong)*(undefined8 *)(puVar5 + uVar11) >> 0x22) == 2) {
      local_5d.value =
           (byte)puVar5[uVar11 + 2] & 1 ^ (this->assigns).data[(int)puVar5[uVar11 + 2] >> 1].value;
      bVar8 = lbool::operator==(&local_5d,(lbool)0x1);
      if (bVar8) {
        *(ulong *)(puVar5 + uVar11 + 2) =
             CONCAT44((int)*(undefined8 *)(puVar5 + uVar11 + 2),
                      (int)((ulong)*(undefined8 *)(puVar5 + uVar11 + 2) >> 0x20));
      }
    }
    for (uVar12 = 1; uVar12 < *(ulong *)(puVar5 + uVar11) >> 0x22; uVar12 = uVar12 + 1) {
      p_1.x = puVar5[uVar11 + uVar12 + 2];
      iVar10 = p_1.x >> 1;
      pcVar6 = (this->seen).data;
      if (pcVar6[iVar10] == '\0') {
        pVVar7 = (this->vardata).data;
        uVar4 = pVVar7[iVar10].level;
        if (0 < (int)uVar4) {
          if ((pVVar7[iVar10].reason == 0xffffffff) || ((local_5c >> (uVar4 & 0x1f) & 1) == 0))
          goto LAB_00118043;
          pcVar6[iVar10] = '\x01';
          vec<Minisat::Lit>::push(&this->analyze_stack,&p_1);
          vec<Minisat::Lit>::push(&this->analyze_toclear,&p_1);
          puVar1 = &(this->statistics).solveSteps;
          *puVar1 = *puVar1 + 1;
        }
      }
    }
  }
LAB_0011807f:
  return iVar3 < 1;
LAB_00118043:
  for (; iVar10 = (this->analyze_toclear).sz, lVar9 < iVar10; lVar9 = lVar9 + 1) {
    (this->seen).data[(this->analyze_toclear).data[lVar9].x >> 1] = '\0';
  }
  vec<Minisat::Lit>::shrink(&this->analyze_toclear,iVar10 - iVar2);
  goto LAB_0011807f;
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels)
{
    analyze_stack.clear();
    analyze_stack.push(p);
    int top = analyze_toclear.size();
    while (analyze_stack.size() > 0) {
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause &c = ca[reason(var(analyze_stack.last()))];
        analyze_stack.pop();

        // Special handling for binary clauses like in 'analyze()'.
        if (c.size() == 2 && value(c[0]) == l_False) {
            assert(value(c[1]) == l_True);
            Lit tmp = c[0];
            c[0] = c[1], c[1] = tmp;
        }

        for (int i = 1; i < c.size(); i++) {
            Lit p = c[i];
            if (!seen[var(p)] && level(var(p)) > 0) {
                if (reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0) {
                    seen[var(p)] = 1;
                    analyze_stack.push(p);
                    analyze_toclear.push(p);
                    statistics.solveSteps++;
                } else {
                    for (int j = top; j < analyze_toclear.size(); j++) seen[var(analyze_toclear[j])] = 0;
                    analyze_toclear.shrink(analyze_toclear.size() - top);
                    return false;
                }
            }
        }
    }

    return true;
}